

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_negation_range_inplace
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  bool bVar1;
  run_container_t *src_00;
  int iVar2;
  container_t *pcVar3;
  rle16_t local_50;
  rle16_t local_4c;
  rle16_t next;
  rle16_t buffered;
  int k;
  int my_nbr_runs;
  run_container_t *ans;
  _Bool local_2d;
  int ans_1;
  _Bool first_val_past_range;
  _Bool last_val_in_range;
  _Bool first_val_in_range;
  _Bool last_val_before_range;
  container_t **ppcStack_28;
  uint8_t return_typecode;
  container_t **dst_local;
  int range_end_local;
  int range_start_local;
  run_container_t *src_local;
  
  if (range_start < range_end) {
    ppcStack_28 = dst;
    dst_local._0_4_ = range_end;
    dst_local._4_4_ = range_start;
    _range_end_local = src;
    if (src->capacity == src->n_runs) {
      ans_1._2_1_ = false;
      ans_1._1_1_ = 0;
      ans_1._0_1_ = 0;
      local_2d = false;
      if (0 < range_start) {
        ans_1._2_1_ = run_container_contains(src,(short)range_start - 1);
      }
      ans_1._1_1_ = run_container_contains(_range_end_local,(uint16_t)dst_local._4_4_);
      if ((ans_1._2_1_ & 1) == ans_1._1_1_) {
        ans_1._0_1_ = run_container_contains(_range_end_local,(short)(int)dst_local - 1);
        if ((int)dst_local != 0x10000) {
          local_2d = run_container_contains(_range_end_local,(uint16_t)(int)dst_local);
        }
        if ((_Bool)((byte)ans_1 & 1) == local_2d) {
          iVar2 = run_container_negation_range
                            (_range_end_local,dst_local._4_4_,(int)dst_local,ppcStack_28);
          run_container_free(_range_end_local);
          return iVar2;
        }
      }
    }
    src_00 = _range_end_local;
    iVar2 = _range_end_local->n_runs;
    _range_end_local->n_runs = 0;
    next.value = 0;
    next.length = 0;
    while( true ) {
      bVar1 = false;
      if ((int)next < iVar2) {
        bVar1 = (int)(uint)_range_end_local->runs[(int)next].value < dst_local._4_4_;
      }
      if (!bVar1) break;
      _range_end_local->n_runs = _range_end_local->n_runs + 1;
      next = (rle16_t)((int)next + 1);
    }
    memset(&local_4c,0,4);
    local_50 = local_4c;
    if ((int)next < iVar2) {
      local_4c = _range_end_local->runs[(int)next];
    }
    run_container_smart_append_exclusive
              (src_00,(uint16_t)dst_local._4_4_,
               ((short)(int)dst_local - (uint16_t)dst_local._4_4_) - 1);
    for (; (int)next < iVar2; next = (rle16_t)((int)next + 1)) {
      if ((int)next + 1 < iVar2) {
        local_50 = _range_end_local->runs[(int)next + 1];
      }
      run_container_smart_append_exclusive(src_00,local_4c.value,local_4c.length);
      local_4c = local_50;
    }
    pcVar3 = convert_run_to_efficient_container(src_00,(uint8_t *)((long)&ans_1 + 3));
    *ppcStack_28 = pcVar3;
    if (ans_1._3_1_ != 3) {
      run_container_free(src_00);
    }
    src_local._4_4_ = (uint)ans_1._3_1_;
  }
  else {
    *dst = src;
    src_local._4_4_ = 3;
  }
  return src_local._4_4_;
}

Assistant:

int run_container_negation_range_inplace(
    run_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    uint8_t return_typecode;

    if (range_end <= range_start) {
        *dst = src;
        return RUN_CONTAINER_TYPE;
    }

    // TODO: efficient special case when range is 0 to 65535 inclusive

    if (src->capacity == src->n_runs) {
        // no excess room.  More checking to see if result can fit
        bool last_val_before_range = false;
        bool first_val_in_range = false;
        bool last_val_in_range = false;
        bool first_val_past_range = false;

        if (range_start > 0)
            last_val_before_range =
                run_container_contains(src, (uint16_t)(range_start - 1));
        first_val_in_range = run_container_contains(src, (uint16_t)range_start);

        if (last_val_before_range == first_val_in_range) {
            last_val_in_range =
                run_container_contains(src, (uint16_t)(range_end - 1));
            if (range_end != 0x10000)
                first_val_past_range =
                    run_container_contains(src, (uint16_t)range_end);

            if (last_val_in_range ==
                first_val_past_range) {  // no space for inplace
                int ans = run_container_negation_range(src, range_start,
                                                       range_end, dst);
                run_container_free(src);
                return ans;
            }
        }
    }
    // all other cases: result will fit

    run_container_t *ans = src;
    int my_nbr_runs = src->n_runs;

    ans->n_runs = 0;
    int k = 0;
    for (; (k < my_nbr_runs) && (src->runs[k].value < range_start); ++k) {
        // ans->runs[k] = src->runs[k]; (would be self-copy)
        ans->n_runs++;
    }

    // as with Java implementation, use locals to give self a buffer of depth 1
    rle16_t buffered = MAKE_RLE16(0, 0);
    rle16_t next = buffered;
    if (k < my_nbr_runs) buffered = src->runs[k];

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < my_nbr_runs; ++k) {
        if (k + 1 < my_nbr_runs) next = src->runs[k + 1];

        run_container_smart_append_exclusive(ans, buffered.value,
                                             buffered.length);
        buffered = next;
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}